

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O1

T_INDEX __thiscall
Nova::Grid<float,_1>::Cell(Grid<float,_1> *this,TV *location,int number_of_ghost_cells)

{
  int in_ECX;
  undefined4 in_register_00000014;
  T_INDEX *index;
  
  (this->counts)._data._M_elems[0] = 0;
  (this->counts)._data._M_elems[0] =
       (int)((float)(in_ECX + 1) +
            (*(float *)CONCAT44(in_register_00000014,number_of_ghost_cells) -
            location[1]._data._M_elems[0]) * location[4]._data._M_elems[0]) - in_ECX;
  return (T_INDEX)SUB84(this,0);
}

Assistant:

T_INDEX Cell(const TV& location,const int number_of_ghost_cells) const
    {
        T_INDEX index;
        Cell(location,index,number_of_ghost_cells);
        return index;
    }